

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>
          (Interpolator<false> *this,hugeint_t *v_t,Vector *result,
          MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  long lVar4;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp_01;
  hugeint_t input;
  hugeint_t input_00;
  bool bVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  hugeint_t hVar9;
  hugeint_t hVar10;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t result_1;
  uint64_t in_stack_ffffffffffffff80;
  _Alloc_hider _Var11;
  undefined7 uStack_67;
  hugeint_t local_58;
  hugeint_t local_48;
  
  bVar5 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar6 = (long)(iVar3 * 0x10 + iVar2 * -0x10) >> 4;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = uStack_67;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    _Var11._M_p = (pointer)accessor->median->lower;
    duckdb::hugeint_t::operator-(v_t + this->FRN,(hugeint_t *)&stack0xffffffffffffff88);
    input.upper = (int64_t)_Var11._M_p;
    input.lower = in_stack_ffffffffffffff80;
    hVar9 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input);
    input_01.lower = hVar9.upper;
    iVar8 = 0;
    bVar5 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar9,&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar8;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar9.lower,input_01);
      duckdb::InvalidInputException::InvalidInputException
                (pIVar7,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar10.upper = local_58.upper;
    hVar10.lower = local_58.lower;
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar6 = (long)(iVar3 * 0x10 + iVar2 * -0x10) >> 4;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = uStack_67;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar6 = (long)(iVar2 * 0x10 + iVar1 * -0x10) >> 4;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = uStack_67;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    _Var11._M_p = (pointer)accessor->median->lower;
    duckdb::hugeint_t::operator-(v_t + this->FRN,(hugeint_t *)&stack0xffffffffffffff88);
    hVar9.upper = (int64_t)_Var11._M_p;
    hVar9.lower = in_stack_ffffffffffffff80;
    hVar9 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar9);
    input_02.lower = hVar9.upper;
    iVar8 = 0;
    bVar5 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar9,&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_02.upper = iVar8;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar9.lower,input_02);
      duckdb::InvalidInputException::InvalidInputException
                (pIVar7,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48.lower = local_58.lower;
    local_48.upper = local_58.upper;
    _Var11._M_p = (pointer)accessor->median->lower;
    duckdb::hugeint_t::operator-(v_t + this->CRN,(hugeint_t *)&stack0xffffffffffffff88);
    input_00.upper = (int64_t)_Var11._M_p;
    input_00.lower = in_stack_ffffffffffffff80;
    hVar9 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input_00);
    input_03.lower = hVar9.upper;
    iVar8 = 0;
    bVar5 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar9,&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_03.upper = iVar8;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar9.lower,input_03);
      duckdb::InvalidInputException::InvalidInputException
                (pIVar7,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar10 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (hugeint_t *)&stack0xffffffffffffff88);
  }
  return hVar10;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}